

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O0

char * kj::_::fill<kj::CappedArray<char,14ul>,kj::StringPtr&,kj::CappedArray<char,8ul>>
                 (char *target,CappedArray<char,_14UL> *first,StringPtr *rest,
                 CappedArray<char,_8UL> *rest_1)

{
  char *pcVar1;
  StringPtr *first_00;
  CappedArray<char,_8UL> *rest_00;
  char *end;
  char *i;
  CappedArray<char,_8UL> *rest_local_1;
  StringPtr *rest_local;
  CappedArray<char,_14UL> *first_local;
  char *target_local;
  
  end = CappedArray<char,_14UL>::begin(first);
  pcVar1 = CappedArray<char,_14UL>::end(first);
  first_local = (CappedArray<char,_14UL> *)target;
  while (end != pcVar1) {
    *(char *)&first_local->currentSize = *end;
    end = end + 1;
    first_local = (CappedArray<char,_14UL> *)((long)&first_local->currentSize + 1);
  }
  first_00 = fwd<kj::StringPtr&>(rest);
  rest_00 = fwd<kj::CappedArray<char,8ul>>(rest_1);
  pcVar1 = fill<kj::StringPtr,kj::CappedArray<char,8ul>>((char *)first_local,first_00,rest_00);
  return pcVar1;
}

Assistant:

char* fill(char* __restrict__ target, const First& first, Rest&&... rest) {
  auto i = first.begin();
  auto end = first.end();
  while (i != end) {
    *target++ = *i++;
  }
  return fill(target, kj::fwd<Rest>(rest)...);
}